

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkIvyRewrite(Abc_Ntk_t *pNtk,int fUpdateLevel,int fUseZeroCost,int fVerbose)

{
  Ivy_Man_t *p;
  Abc_Ntk_t *pAVar1;
  
  p = Abc_NtkIvyBefore(pNtk,0,0);
  if (p == (Ivy_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  else {
    Ivy_ManRewritePre(p,fUpdateLevel,fUseZeroCost,fVerbose);
    pAVar1 = Abc_NtkIvyAfter(pNtk,p,0,0);
    Ivy_ManStop(p);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyRewrite( Abc_Ntk_t * pNtk, int fUpdateLevel, int fUseZeroCost, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
//timeRetime = Abc_Clock();
    Ivy_ManRewritePre( pMan, fUpdateLevel, fUseZeroCost, fVerbose );
//timeRetime = Abc_Clock() - timeRetime;
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}